

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImRect IVar8;
  
  IVar8 = ImGuiWindow::Rect(window);
  fVar1 = window->WindowBorderSize;
  fVar4 = (&(window->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  if (axis == ImGuiAxis_X) {
    fVar5 = (window->InnerRect).Min.x;
    fVar7 = IVar8.Max.y - fVar1;
    fVar4 = fVar7 - fVar4;
    uVar2 = -(uint)(fVar4 <= IVar8.Min.y);
    fVar6 = (float)(uVar2 & (uint)IVar8.Min.y | ~uVar2 & (uint)fVar4);
    fVar3 = (window->InnerRect).Max.x - fVar1;
  }
  else {
    fVar6 = (window->InnerRect).Min.y;
    fVar3 = IVar8.Max.x - fVar1;
    fVar4 = fVar3 - fVar4;
    uVar2 = -(uint)(fVar4 <= IVar8.Min.x);
    fVar5 = (float)(uVar2 & (uint)IVar8.Min.x | ~uVar2 & (uint)fVar4);
    fVar7 = (window->InnerRect).Max.y - fVar1;
  }
  IVar8.Min.y = fVar6;
  IVar8.Min.x = fVar5;
  IVar8.Max.y = fVar7;
  IVar8.Max.x = fVar3;
  return IVar8;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x - border_size, outer_rect.Max.y - border_size);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x - border_size, inner_rect.Max.y - border_size);
}